

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<char[9]>(char *fmt,char (*args) [9])

{
  string *in_RDI;
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream *this;
  char *in_stack_fffffffffffffe58;
  ostream *in_stack_fffffffffffffe60;
  ostringstream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_180;
  std::__cxx11::ostringstream::ostringstream(this);
  format<char[9]>(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(char (*) [9])this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}